

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void QGuiApplicationPrivate::processCloseEvent(CloseEvent *e)

{
  QPointer<QWindow> *this;
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_28 [12];
  bool bStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = &e->window;
  bVar3 = QWeakPointer<QObject>::isNull(&this->wp);
  if (!bVar3) {
    if ((((this->wp).d == (Data *)0x0) ||
        (lVar1 = *(long *)((e->window).wp.value + 8), *(char *)(lVar1 + 0x13c) != '\x01')) ||
       (*(char *)(lVar1 + 0x93) != '\0')) {
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffe0 = &DAT_aaaaaaaaaaaaaaaa;
      QCloseEvent::QCloseEvent((QCloseEvent *)local_28);
      pDVar2 = (this->wp).d;
      if ((pDVar2 == (Data *)0x0) ||
         ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = (e->window).wp.value;
      }
      QCoreApplication::sendSpontaneousEvent((QObject *)pQVar4,(QEvent *)local_28);
      (e->super_WindowSystemEvent).eventAccepted = bStack_1c;
      QCloseEvent::~QCloseEvent((QCloseEvent *)local_28);
    }
    else {
      (e->super_WindowSystemEvent).eventAccepted = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processCloseEvent(QWindowSystemInterfacePrivate::CloseEvent *e)
{
    if (e->window.isNull())
        return;
    if (e->window.data()->d_func()->blockedByModalWindow && !e->window.data()->d_func()->inClose) {
        // a modal window is blocking this window, don't allow close events through, unless they
        // originate from a call to QWindow::close.
        e->eventAccepted = false;
        return;
    }

    QCloseEvent event;
    QGuiApplication::sendSpontaneousEvent(e->window.data(), &event);

    e->eventAccepted = event.isAccepted();
}